

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.c
# Opt level: O3

int enet_socket_receive(ENetSocket socket,ENetAddress *address,ENetBuffer *buffers,
                       size_t bufferCount)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  int iVar4;
  sockaddr_in sin;
  msghdr msgHdr;
  undefined1 auStack_58 [2];
  ushort local_56;
  enet_uint32 local_54;
  msghdr local_48;
  
  local_48.msg_name = (undefined1 *)0x0;
  local_48.msg_namelen = 0;
  local_48._12_4_ = 0;
  local_48.msg_control = (void *)0x0;
  local_48.msg_controllen = 0;
  local_48._48_8_ = 0;
  if (address != (ENetAddress *)0x0) {
    local_48.msg_namelen = 0x10;
    local_48._12_4_ = 0;
    local_48.msg_name = auStack_58;
  }
  local_48.msg_iov = (iovec *)buffers;
  local_48.msg_iovlen = bufferCount;
  sVar2 = recvmsg(socket,&local_48,0x4000);
  iVar1 = (int)sVar2;
  if (iVar1 == -1) {
    piVar3 = __errno_location();
    iVar4 = -(uint)(*piVar3 != 0xb);
  }
  else {
    iVar4 = -1;
    if ((local_48._48_8_ & 0x20) == 0) {
      iVar4 = iVar1;
    }
    if (address != (ENetAddress *)0x0 && (local_48._48_8_ & 0x20) == 0) {
      address->host = local_54;
      address->port = local_56 << 8 | local_56 >> 8;
      iVar4 = iVar1;
    }
  }
  return iVar4;
}

Assistant:

int
enet_socket_receive (ENetSocket socket,
                     ENetAddress * address,
                     ENetBuffer * buffers,
                     size_t bufferCount)
{
    struct msghdr msgHdr;
    struct sockaddr_in sin;
    int recvLength;

    memset (& msgHdr, 0, sizeof (struct msghdr));

    if (address != NULL)
    {
        msgHdr.msg_name = & sin;
        msgHdr.msg_namelen = sizeof (struct sockaddr_in);
    }

    msgHdr.msg_iov = (struct iovec *) buffers;
    msgHdr.msg_iovlen = bufferCount;

    recvLength = recvmsg (socket, & msgHdr, MSG_NOSIGNAL);

    if (recvLength == -1)
    {
       if (errno == EWOULDBLOCK)
         return 0;

       return -1;
    }

#ifdef HAS_MSGHDR_FLAGS
    if (msgHdr.msg_flags & MSG_TRUNC)
      return -1;
#endif

    if (address != NULL)
    {
        address -> host = (enet_uint32) sin.sin_addr.s_addr;
        address -> port = ENET_NET_TO_HOST_16 (sin.sin_port);
    }

    return recvLength;
}